

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O1

void mbedtls_debug_print_crt
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,
               mbedtls_x509_crt *crt)

{
  mbedtls_x509_crt *pmVar1;
  int iVar2;
  size_t __n;
  long lVar3;
  char *pcVar4;
  char *buf_00;
  char *pcVar5;
  char str_1 [512];
  char buf [1024];
  char str [512];
  char local_858 [15];
  undefined1 local_849;
  char *local_848;
  mbedtls_x509_crt *local_840;
  mbedtls_pk_debug_item local_838;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  char local_638 [1024];
  char local_238 [520];
  
  if ((((ssl->conf == (mbedtls_ssl_config *)0x0) || (crt == (mbedtls_x509_crt *)0x0)) ||
      (ssl->conf->f_dbg == (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0)) ||
     (local_848 = text, debug_threshold < level)) {
    return;
  }
LAB_00167f29:
  snprintf(local_238,0x200,"%s #%d:\n",local_848);
  (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_238);
  buf_00 = local_638;
  local_840 = crt;
  mbedtls_x509_crt_info(buf_00,0x3ff,anon_var_dwarf_1779fc + 9,crt);
  pcVar4 = local_638 + 1;
  pcVar5 = pcVar4;
  do {
    pmVar1 = local_840;
    if (pcVar4[-1] == '\n') {
      __n = (long)pcVar5 - (long)buf_00;
      if (0x1fe < __n) {
        __n = 0x1ff;
      }
      memcpy(&local_838,buf_00,__n);
      *(undefined1 *)((long)&local_838.type + __n) = 0;
      (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,(char *)&local_838);
      buf_00 = pcVar4;
    }
    else if (pcVar4[-1] == '\0') break;
    pcVar4 = pcVar4 + 1;
    pcVar5 = pcVar5 + 1;
  } while( true );
  local_838.type = MBEDTLS_PK_DEBUG_NONE;
  local_838._4_4_ = 0;
  local_838.name = (char *)0x0;
  local_838.value = (void *)0x0;
  uStack_820 = 0;
  local_818 = 0;
  uStack_810 = 0;
  local_808 = 0;
  uStack_800 = 0;
  local_7f8 = 0;
  iVar2 = mbedtls_pk_debug(&local_840->pk,&local_838);
  if (iVar2 == 0) {
    lVar3 = 0x10;
    do {
      if (*(int *)((long)&local_848 + lVar3) == 0) break;
      snprintf(local_858,0x10,"%s%s","crt->",*(undefined8 *)((long)&local_840 + lVar3));
      local_849 = 0;
      if (*(int *)((long)&local_848 + lVar3) == 2) {
        mbedtls_debug_print_ecp
                  (ssl,level,file,line,local_858,
                   *(mbedtls_ecp_point **)((long)&local_838.type + lVar3));
      }
      else if (*(int *)((long)&local_848 + lVar3) == 1) {
        mbedtls_debug_print_mpi
                  (ssl,level,file,line,local_858,*(mbedtls_mpi **)((long)&local_838.type + lVar3));
      }
      else {
        (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,"should not happen\n");
      }
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x58);
  }
  else {
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,"invalid PK context\n");
  }
  crt = pmVar1->next;
  if (crt == (mbedtls_x509_crt *)0x0) {
    return;
  }
  goto LAB_00167f29;
}

Assistant:

void mbedtls_debug_print_crt( const mbedtls_ssl_context *ssl, int level,
                      const char *file, int line,
                      const char *text, const mbedtls_x509_crt *crt )
{
    char str[DEBUG_BUF_SIZE];
    int i = 0;

    if( ssl->conf == NULL || ssl->conf->f_dbg == NULL || crt == NULL || level > debug_threshold )
        return;

    while( crt != NULL )
    {
        char buf[1024];

        mbedtls_snprintf( str, sizeof( str ), "%s #%d:\n", text, ++i );
        debug_send_line( ssl, level, file, line, str );

        mbedtls_x509_crt_info( buf, sizeof( buf ) - 1, "", crt );
        debug_print_line_by_line( ssl, level, file, line, buf );

        debug_print_pk( ssl, level, file, line, "crt->", &crt->pk );

        crt = crt->next;
    }
}